

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

vm_val_t * CVmRun::get_fp_at_level(int level)

{
  int iVar1;
  int in_EDI;
  vm_rcdesc *rc;
  vm_val_t *fp;
  vm_rcdesc *local_18;
  vm_val_t *local_10;
  int local_4;
  
  local_10 = frame_ptr_;
  local_18 = (vm_rcdesc *)0x0;
  for (local_4 = in_EDI; local_10 != (vm_val_t *)0x0 && local_4 != 0; local_4 = local_4 + -1) {
    if ((local_18 != (vm_rcdesc *)0x0) && (iVar1 = vm_rcdesc::has_return_addr(local_18), iVar1 != 0)
       ) {
      local_18 = (vm_rcdesc *)0x0;
      local_4 = local_4 + -1;
      if (local_4 == 0) break;
    }
    local_18 = get_rcdesc_from_frame((vm_val_t *)0x2360df);
    local_10 = get_enclosing_frame_ptr((vm_val_t *)0x2360ee);
  }
  if ((local_10 != (vm_val_t *)0x0) &&
     ((local_18 == (vm_rcdesc *)0x0 || (iVar1 = vm_rcdesc::has_return_addr(local_18), iVar1 == 0))))
  {
    return local_10;
  }
  err_throw(0);
}

Assistant:

vm_val_t *CVmRun::get_fp_at_level(VMG_ int level) VM_REG_CONST
{
    vm_val_t *fp;
    const vm_rcdesc *rc;
    
    /* walk up the stack to the desired level */
    for (fp = frame_ptr_, rc = 0 ; fp != 0 && level != 0 ; --level)
    {
        /* if this is a recursive level, count it */
        if (rc != 0 && rc->has_return_addr())
        {
            /* move to the bytecode caller at this level */
            rc = 0;
            
            /* count the level */
            if (--level == 0)
                break;
        }

        /* move to the enclosing level */
        rc = get_rcdesc_from_frame(vmg_ fp);
        fp = get_enclosing_frame_ptr(vmg_ fp);
    }

    /* 
     *   if we ran out of frames before we reached the desired level, or we
     *   stopped at a native caller, the requested frame doesn't exist 
     */
    if (fp == 0 || (rc != 0 && rc->has_return_addr()))
        err_throw(VMERR_BAD_FRAME);

    /* return the frame */
    return fp;
}